

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int attlist8(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  
  if (tok == 0xf) {
    return 0x21;
  }
  pcVar3 = attlist1;
  if (tok == 0x1b) {
    iVar2 = 0x25;
    goto LAB_0062b3ab;
  }
  if (tok == 0x14) {
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + enc->minBytesPerChar,end,"IMPLIED");
    iVar2 = 0x23;
    if (iVar1 != 0) goto LAB_0062b3ab;
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + enc->minBytesPerChar,end,"REQUIRED");
    iVar2 = 0x24;
    if (iVar1 != 0) goto LAB_0062b3ab;
    iVar2 = (*enc->nameMatchesAscii)(enc,ptr + enc->minBytesPerChar,end,"FIXED");
    if (iVar2 != 0) {
      iVar2 = 0x21;
      pcVar3 = attlist9;
      goto LAB_0062b3ab;
    }
  }
  iVar2 = -1;
  pcVar3 = error;
LAB_0062b3ab:
  state->handler = pcVar3;
  return iVar2;
}

Assistant:

static int PTRCALL
attlist8(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_POUND_NAME:
    if (XmlNameMatchesAscii(enc, ptr + MIN_BYTES_PER_CHAR(enc), end,
                            KW_IMPLIED)) {
      state->handler = attlist1;
      return XML_ROLE_IMPLIED_ATTRIBUTE_VALUE;
    }
    if (XmlNameMatchesAscii(enc, ptr + MIN_BYTES_PER_CHAR(enc), end,
                            KW_REQUIRED)) {
      state->handler = attlist1;
      return XML_ROLE_REQUIRED_ATTRIBUTE_VALUE;
    }
    if (XmlNameMatchesAscii(enc, ptr + MIN_BYTES_PER_CHAR(enc), end,
                            KW_FIXED)) {
      state->handler = attlist9;
      return XML_ROLE_ATTLIST_NONE;
    }
    break;
  case XML_TOK_LITERAL:
    state->handler = attlist1;
    return XML_ROLE_DEFAULT_ATTRIBUTE_VALUE;
  }
  return common(state, tok);
}